

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O2

string * getTemplateString_abi_cxx11_(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string rootDir;
  string args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string
            ((string *)&local_28,
             "{ApprovalsSubdirectory}/{TestFileName}.{TestCaseName}.{ApprovedOrReceived}.{FileExtension}"
             ,(allocator *)&bStack_48);
  getApprovedFilesLocation_abi_cxx11_();
  std::operator+(in_RDI,&bStack_48,&local_28);
  std::__cxx11::string::~string((string *)&bStack_48);
  std::__cxx11::string::~string((string *)&local_28);
  return in_RDI;
}

Assistant:

std::string getTemplateString()
{
    std::string args =
        "{ApprovalsSubdirectory}/"
        "{TestFileName}.{TestCaseName}.{ApprovedOrReceived}.{FileExtension}";

    std::string rootDir = getApprovedFilesLocation();
    std::string templateString = rootDir + args;
    return templateString;
}